

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O0

void Dtt_DumpLibrary(Dtt_Man_t *p,char *FileName)

{
  Vec_Int_t *pVVar1;
  Vec_Vec_t *pVVar2;
  Vec_Vec_t *pVVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint tNpn;
  uint tNpn_00;
  uint tFun;
  Vec_Ptr_t *pVVar7;
  int Fanin2Npn;
  int Fanin1Npn;
  int Fanin2;
  int NP;
  Vec_Vec_t *vLibImpl;
  Vec_Int_t *vLibFun;
  Dtt_FunImpl_t *pFun2;
  Dtt_FunImpl_t *pFun;
  int fRepeat;
  int Entry;
  int j;
  int i;
  char sFI2 [50];
  char sFI1 [50];
  char local_88 [8];
  char str [100];
  FILE *pFile;
  char *FileName_local;
  Dtt_Man_t *p_local;
  
  vLibImpl = (Vec_Vec_t *)Vec_IntDup(p->vTruthNpns);
  Vec_IntUniqify((Vec_Int_t *)vLibImpl);
  iVar4 = Vec_IntSize((Vec_Int_t *)vLibImpl);
  _Fanin2 = Vec_VecStart(iVar4);
  Entry = 0;
  do {
    iVar4 = Entry;
    iVar5 = Vec_IntSize(p->vTruths);
    if (iVar5 <= iVar4) {
      register0x00000000 = fopen(FileName,"wb");
      for (Entry = 0; iVar4 = Entry, iVar5 = Vec_IntSize((Vec_Int_t *)vLibImpl), iVar4 < iVar5;
          Entry = Entry + 1) {
        pFun._4_4_ = Vec_IntEntry((Vec_Int_t *)vLibImpl,Entry);
        if (1 < Entry) {
          fRepeat = 0;
          while( true ) {
            iVar4 = fRepeat;
            pVVar7 = Vec_VecEntry(_Fanin2,Entry);
            iVar5 = Vec_PtrSize(pVVar7);
            if (iVar5 <= iVar4) break;
            pVVar7 = Vec_VecEntry(_Fanin2,Entry);
            pFun2 = (Dtt_FunImpl_t *)Vec_PtrEntry(pVVar7,fRepeat);
            local_88[0] = '\0';
            Dtt_MakeFormula(pFun._4_4_,pFun2,_Fanin2,0x43210,local_88,1,
                            (FILE *)stack0xffffffffffffffe0);
            fRepeat = fRepeat + 1;
          }
        }
      }
      fclose(stack0xffffffffffffffe0);
      printf("Dumped file \"%s\". \n",FileName);
      fflush(_stdout);
      return;
    }
    pFun._4_4_ = Vec_IntEntry(p->vTruths,Entry);
    if (1 < Entry) {
      pFun2 = (Dtt_FunImpl_t *)calloc(1,0x14);
      uVar6 = Vec_IntEntry(p->vConfigs,Entry);
      pFun2->Type = uVar6 & 7;
      pVVar1 = p->vTruths;
      iVar4 = Vec_IntEntry(p->vFanins,Entry * 2 + 1);
      uVar6 = Vec_IntEntry(pVVar1,iVar4);
      pVVar1 = p->vTruthNpns;
      iVar4 = Vec_IntEntry(p->vFanins,Entry << 1);
      tNpn = Vec_IntEntry(pVVar1,iVar4);
      pVVar1 = p->vTruthNpns;
      iVar4 = Vec_IntEntry(p->vFanins,Entry * 2 + 1);
      tNpn_00 = Vec_IntEntry(pVVar1,iVar4);
      iVar4 = Vec_IntFind((Vec_Int_t *)vLibImpl,tNpn);
      pFun2->FI1 = iVar4;
      iVar4 = Vec_IntFind((Vec_Int_t *)vLibImpl,tNpn_00);
      pFun2->FI2 = iVar4;
      pFun._0_4_ = 0;
      fRepeat = 0;
      while( true ) {
        iVar4 = fRepeat;
        pVVar3 = vLibImpl;
        pVVar2 = _Fanin2;
        iVar5 = Vec_IntEntry(p->vTruthNpns,Entry);
        iVar5 = Vec_IntFind((Vec_Int_t *)pVVar3,iVar5);
        pVVar7 = Vec_VecEntry(pVVar2,iVar5);
        iVar5 = Vec_PtrSize(pVVar7);
        pVVar3 = vLibImpl;
        pVVar2 = _Fanin2;
        if (iVar5 <= iVar4) break;
        iVar4 = Vec_IntEntry(p->vTruthNpns,Entry);
        iVar4 = Vec_IntFind((Vec_Int_t *)pVVar3,iVar4);
        pVVar7 = Vec_VecEntry(pVVar2,iVar4);
        vLibFun = (Vec_Int_t *)Vec_PtrEntry(pVVar7,fRepeat);
        if (((*(int *)&vLibFun->pArray == pFun2->FI1) && (vLibFun[1].nCap == pFun2->FI2)) ||
           ((vLibFun[1].nCap == pFun2->FI1 && (*(int *)&vLibFun->pArray == pFun2->FI2)))) {
          pFun._0_4_ = 1;
          break;
        }
        fRepeat = fRepeat + 1;
      }
      if ((int)pFun == 0) {
        tFun = Vec_IntEntry(p->vTruthNpns,Entry);
        Dtt_FindNP(p,tFun,0,pFun._4_4_,&Fanin1Npn,&pFun2->Type,0);
        Dtt_FindNP(p,uVar6,pFun._4_4_,tNpn,&pFun2->NP1,&pFun2->Type,Fanin1Npn);
        Dtt_FindNP(p,uVar6,0,tNpn_00,&pFun2->NP2,&pFun2->Type,Fanin1Npn);
        pVVar3 = vLibImpl;
        pVVar2 = _Fanin2;
        iVar4 = Vec_IntEntry(p->vTruthNpns,Entry);
        iVar4 = Vec_IntFind((Vec_Int_t *)pVVar3,iVar4);
        Vec_VecPush(pVVar2,iVar4,pFun2);
      }
      else if (pFun2 != (Dtt_FunImpl_t *)0x0) {
        free(pFun2);
        pFun2 = (Dtt_FunImpl_t *)0x0;
      }
    }
    Entry = Entry + 1;
  } while( true );
}

Assistant:

void Dtt_DumpLibrary( Dtt_Man_t * p, char* FileName )
{
    FILE * pFile;
    char str[100], sFI1[50], sFI2[50];
    int i, j, Entry, fRepeat;
    Dtt_FunImpl_t * pFun, * pFun2;
    Vec_Int_t * vLibFun = Vec_IntDup( p->vTruthNpns );  // none-duplicating vector of NPN representitives
    Vec_Vec_t * vLibImpl;
    Vec_IntUniqify( vLibFun );
    vLibImpl = Vec_VecStart( Vec_IntSize( vLibFun ) );
    Vec_IntForEachEntry( p->vTruths, Entry, i )
    {
        int NP, Fanin2, Fanin1Npn, Fanin2Npn;
        if (i<2) continue; // skip const 0
        pFun = ABC_CALLOC( Dtt_FunImpl_t, 1 );
        pFun->Type = (int)( 0x7 & Vec_IntEntry(p->vConfigs, i) );
        //word Fanin1 = Vec_IntEntry( p->vTruths, Vec_IntEntry( p->vFanins, i*2 ) );
        Fanin2 = Vec_IntEntry( p->vTruths, Vec_IntEntry( p->vFanins, i*2+1 ) );
        Fanin1Npn = Vec_IntEntry( p->vTruthNpns, Vec_IntEntry( p->vFanins, i*2 ) );
        Fanin2Npn = Vec_IntEntry( p->vTruthNpns, Vec_IntEntry( p->vFanins, i*2+1 ) );
        pFun->FI1 = Vec_IntFind( vLibFun, Fanin1Npn );
        pFun->FI2 = Vec_IntFind( vLibFun, Fanin2Npn );
        
        fRepeat = 0;
        Vec_VecForEachEntryLevel( Dtt_FunImpl_t*, vLibImpl, pFun2, j, Vec_IntFind( vLibFun, Vec_IntEntry( p->vTruthNpns, i ) ) )
        {
            if ( ( pFun2->FI1 == pFun->FI1 && pFun2->FI2 == pFun->FI2 ) || ( pFun2->FI2 == pFun->FI1 && pFun2->FI1 == pFun->FI2 ) )
            {
                fRepeat = 1;
                break;
            }
        }
        if (fRepeat) 
        {
            ABC_FREE( pFun );
            continue;
        }

        Dtt_FindNP( p, Vec_IntEntry( p->vTruthNpns, i ), 0, Entry, &NP, &(pFun->Type), 0 ); //out: tGoal=0, NPout=0
        Dtt_FindNP( p, Fanin2, Entry, Fanin1Npn, &(pFun->NP1), &(pFun->Type), NP ); //FI1
        Dtt_FindNP( p, Fanin2, 0, Fanin2Npn, &(pFun->NP2), &(pFun->Type), NP ); //FI2: tGoal=0
        
        Vec_VecPush( vLibImpl, Vec_IntFind( vLibFun, Vec_IntEntry( p->vTruthNpns, i ) ), pFun );
    }

    // print to file
    pFile = fopen( FileName, "wb" );

    if (0)
    Vec_IntForEachEntry( vLibFun, Entry, i )
    {
        if (!Entry) continue; // skip const 0
        fprintf( pFile, "%08x: ", (unsigned)Entry );
        Vec_VecForEachEntryLevel( Dtt_FunImpl_t*, vLibImpl, pFun, j, i )
        {
            Dtt_FunImplFI2Str( pFun->FI1, pFun->NP1, vLibFun, sFI1 ); 
            Dtt_FunImplFI2Str( pFun->FI2, pFun->NP2, vLibFun, sFI2 );
            Dtt_FunImpl2Str( pFun->Type, sFI1, sFI2, str );
            fprintf( pFile, "%s, ", str );
        }
        fprintf( pFile, "\n" );
    }

    // formula format
    Vec_IntForEachEntry( vLibFun, Entry, i )
    {
        if ( i<2 ) continue; // skip const 0 and buffer
        Vec_VecForEachEntryLevel( Dtt_FunImpl_t*, vLibImpl, pFun, j, i )
        {
            str[0] = 0; //sprintf( str, "" );
            Dtt_MakeFormula( (unsigned)Entry, pFun, vLibImpl, (4<<16)+(3<<12)+(2<<8)+(1<<4), str, 1, pFile );
        }
    }

    fclose( pFile );
    printf( "Dumped file \"%s\". \n", FileName );
    fflush( stdout );
}